

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void basic_suite::test_true(void)

{
  void *in_RDX;
  undefined4 local_64;
  ssize_t local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  
  encoder.storage._8_8_ = &buffer;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encoder.storage._0_8_ = &PTR__base_00112ca8;
  local_60 = trial::protocol::bintoken::detail::basic_encoder<24UL>::write
                       (&encoder,0x81,in_RDX,0x112ca8);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(true)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x43,"void basic_suite::test_true()",&local_60,&local_64);
  local_60 = (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x44,"void basic_suite::test_true()",&local_60,&local_64);
  local_60 = CONCAT44(local_60._4_4_,0x81);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x45,"void basic_suite::test_true()",
             buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_60);
  (**(code **)encoder.storage._0_8_)();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}